

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::B_formatter<spdlog::details::null_scoped_padder>::format
          (B_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  const_reference ppcVar1;
  size_t sVar2;
  memory_buf_t *dest_00;
  string_view_t view;
  null_scoped_padder local_49;
  undefined1 auStack_48 [7];
  null_scoped_padder p;
  string_view_t field_value;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  B_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  ppcVar1 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)details::full_months,(long)tm_time->tm_mon);
  _auStack_48 = (fmt_helper *)*ppcVar1;
  std::char_traits<char>::length((char_type *)_auStack_48);
  sVar2 = fmt::v10::basic_string_view<char>::size((basic_string_view<char> *)auStack_48);
  dest_00 = dest;
  null_scoped_padder::null_scoped_padder
            (&local_49,sVar2,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = field_value.data_;
  fmt_helper::append_string_view(_auStack_48,view,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{full_months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }